

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O2

vector<long,_std::allocator<long>_> *
CoreML::defaultShapeOf
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,ArrayFeatureType *params)

{
  uint64 in_RAX;
  ArrayFeatureType_ShapeRange *pAVar1;
  Type *pTVar2;
  ArrayFeatureType_EnumeratedShapes *pAVar3;
  Type *pTVar4;
  int i;
  int index;
  int iVar5;
  uint64 local_28;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar5 = (params->shape_).current_size_;
  local_28 = in_RAX;
  if (iVar5 < 1) {
    if (params->_oneof_case_[0] == 0x15) {
      iVar5 = 0;
      while( true ) {
        pAVar3 = Specification::ArrayFeatureType::enumeratedshapes(params);
        pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::TypeHandler>
                           (&(pAVar3->shapes_).super_RepeatedPtrFieldBase,0);
        if ((pTVar4->shape_).current_size_ <= iVar5) break;
        pAVar3 = Specification::ArrayFeatureType::enumeratedshapes(params);
        pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::TypeHandler>
                           (&(pAVar3->shapes_).super_RepeatedPtrFieldBase,0);
        local_28 = Specification::ArrayFeatureType_Shape::shape(pTVar4,iVar5);
        std::vector<long,_std::allocator<long>_>::emplace_back<long>
                  (__return_storage_ptr__,(long *)&local_28);
        iVar5 = iVar5 + 1;
      }
    }
    else if (params->_oneof_case_[0] == 0x1f) {
      iVar5 = 0;
      while( true ) {
        pAVar1 = Specification::ArrayFeatureType::shaperange(params);
        if ((pAVar1->sizeranges_).super_RepeatedPtrFieldBase.current_size_ <= iVar5) break;
        pAVar1 = Specification::ArrayFeatureType::shaperange(params);
        pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                           (&(pAVar1->sizeranges_).super_RepeatedPtrFieldBase,iVar5);
        local_28 = pTVar2->lowerbound_;
        std::vector<long,_std::allocator<long>_>::emplace_back<long>
                  (__return_storage_ptr__,(long *)&local_28);
        iVar5 = iVar5 + 1;
      }
    }
  }
  else {
    for (index = 0; index < iVar5; index = index + 1) {
      local_28 = Specification::ArrayFeatureType::shape(params,index);
      std::vector<long,_std::allocator<long>_>::emplace_back<long>
                (__return_storage_ptr__,(long *)&local_28);
      iVar5 = (params->shape_).current_size_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<int64_t> defaultShapeOf(const Specification::ArrayFeatureType &params) {
        std::vector<int64_t> defaultShape;
        if (params.shape_size() > 0) {
            for (int i = 0; i<params.shape_size(); i++) {
                defaultShape.push_back((int64_t)params.shape(i));
            }
            return defaultShape;
        }

        switch (params.ShapeFlexibility_case()) {
            case Specification::ArrayFeatureType::kEnumeratedShapes: {
                for (int i = 0; i < params.enumeratedshapes().shapes(0).shape_size(); i++) {
                    defaultShape.push_back((int64_t)params.enumeratedshapes().shapes(0).shape(i));
                }
                break;
            }
            case Specification::ArrayFeatureType::kShapeRange: {
                for (int i=0; i < params.shaperange().sizeranges_size(); i++) {
                    defaultShape.push_back((int64_t)params.shaperange().sizeranges(i).lowerbound());
                }
                break;
            }
            case Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                break;
        }

        return defaultShape;
    }